

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionFuncs.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::RtoIFunction::eval
          (RtoIFunction *this,EvalContext *context,Args *args,SourceRange param_4,
          SystemCallInfo *param_5)

{
  bool bVar1;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RCX;
  ConstantValue *in_RDI;
  real_t rVar2;
  ConstantValue *this_00;
  ConstantValue val;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  EvalContext *in_stack_ffffffffffffff50;
  Expression *in_stack_ffffffffffffff58;
  ConstantValue *this_01;
  real_t local_80 [3];
  undefined4 local_68;
  
  this_01 = in_RDI;
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
  Expression::eval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x133b731);
  if (bVar1) {
    rVar2 = slang::ConstantValue::real
                      ((ConstantValue *)
                       CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    local_80[0] = rVar2;
    this_00 = (ConstantValue *)real_t::operator_cast_to_double(local_80);
    SVInt::SVInt((SVInt *)this_01,(bitwidth_t)((ulong)rVar2.v >> 0x20),(uint64_t)this_00,
                 (bool)in_stack_ffffffffffffff4f);
    slang::ConstantValue::ConstantValue
              (this_00,(SVInt *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    SVInt::~SVInt((SVInt *)this_01);
  }
  else {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_ffffffffffffff50,
               (nullptr_t)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  }
  local_68 = 1;
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x133b82c);
  return in_RDI;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo&) const final {
        auto val = args[0]->eval(context);
        if (!val)
            return nullptr;

        return SVInt(32, (uint64_t)val.real(), true);
    }